

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O2

double * inform_local_predictive_info
                   (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,double *pi,
                   inform_error *err)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  _Bool _Var5;
  double *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  int *piVar6;
  int *piVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int *local_70;
  int *local_68;
  
  _Var5 = check_arguments(series,n,m,b,kpast,kfuture,err);
  if (_Var5) {
    return (double *)0x0;
  }
  uVar1 = kfuture + kpast;
  lVar18 = ((m - uVar1) + 1) * n;
  __ptr = pi;
  if ((pi != (double *)0x0) || (__ptr = (double *)malloc(lVar18 * 8), __ptr != (double *)0x0)) {
    auVar23._8_4_ = (int)(kpast >> 0x20);
    auVar23._0_8_ = kpast;
    auVar23._12_4_ = 0x45300000;
    dVar20 = pow((double)b,
                 (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
    uVar17 = (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
    auVar21._8_4_ = (int)(kfuture >> 0x20);
    auVar21._0_8_ = kfuture;
    auVar21._12_4_ = 0x45300000;
    dVar20 = pow((double)b,
                 (auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
    uVar11 = (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
    lVar19 = uVar11 * uVar17;
    __ptr_00 = (double *)calloc(uVar11 + uVar17 + lVar19,4);
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (pi != (double *)0x0) goto LAB_00136a18;
    }
    else {
      __ptr_01 = malloc(lVar18 * 0xc);
      if (__ptr_01 != (void *)0x0) {
        lVar4 = uVar17 * 4 + lVar19 * 4;
        piVar6 = (int *)((long)__ptr_01 + lVar18 * 4);
        piVar7 = piVar6 + lVar18;
        local_68 = series + uVar1;
        local_70 = series + kpast;
        pvVar16 = __ptr_01;
        for (sVar14 = 0; iVar15 = 1, sVar14 != n; sVar14 = sVar14 + 1) {
          *piVar6 = 0;
          iVar12 = 0;
          iVar8 = iVar15;
          for (sVar9 = 0; kpast != sVar9; sVar9 = sVar9 + 1) {
            iVar8 = iVar8 * b;
            iVar12 = iVar12 * b + series[sVar9];
            *piVar6 = iVar12;
          }
          *piVar7 = 0;
          iVar12 = 0;
          for (sVar9 = kpast; sVar9 < uVar1; sVar9 = sVar9 + 1) {
            iVar15 = iVar15 * b;
            iVar12 = iVar12 * b + series[sVar9];
            *piVar7 = iVar12;
          }
          lVar13 = 0;
          do {
            lVar10 = (long)piVar7[lVar13] + (long)iVar15 * (long)piVar6[lVar13];
            *(int *)((long)pvVar16 + lVar13 * 4) = (int)lVar10;
            piVar2 = (int *)((long)__ptr_00 + lVar10 * 4);
            *piVar2 = *piVar2 + 1;
            iVar12 = piVar6[lVar13];
            piVar2 = (int *)((long)__ptr_00 + (long)iVar12 * 4 + lVar19 * 4);
            *piVar2 = *piVar2 + 1;
            piVar2 = (int *)((long)__ptr_00 + (long)piVar7[lVar13] * 4 + lVar4);
            *piVar2 = *piVar2 + 1;
            if ((uVar1 - m) + lVar13 != 0) {
              iVar3 = local_70[lVar13];
              piVar6[lVar13 + 1] = (iVar12 * b + iVar3) - series[lVar13] * iVar8;
              piVar7[lVar13 + 1] = (piVar7[lVar13] * b - iVar3 * iVar15) + local_68[lVar13];
            }
            lVar10 = uVar1 + lVar13;
            lVar13 = lVar13 + 1;
          } while (lVar10 + 1U <= m);
          piVar6 = piVar6 + ((m + 1) - uVar1);
          piVar7 = piVar7 + ((m + 1) - uVar1);
          series = series + m;
          local_68 = local_68 + m;
          local_70 = local_70 + m;
          pvVar16 = (void *)((long)pvVar16 + m * 4 + uVar1 * -4 + 4);
        }
        auVar22._8_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar22._0_8_ = lVar18;
        auVar22._12_4_ = 0x45300000;
        for (lVar13 = 0; lVar18 != lVar13; lVar13 = lVar13 + 1) {
          dVar20 = log2(((double)*(uint *)((long)__ptr_00 +
                                          (long)*(int *)((long)__ptr_01 + lVar13 * 4) * 4) *
                        ((auVar22._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0))) /
                        ((double)*(uint *)((long)__ptr_00 +
                                          (long)*(int *)((long)__ptr_01 + lVar13 * 4 + lVar18 * 8) *
                                          4 + lVar4) *
                        (double)*(uint *)((long)__ptr_00 +
                                         (long)*(int *)((long)__ptr_01 + lVar13 * 4 + lVar18 * 4) *
                                         4 + lVar19 * 4)));
          __ptr[lVar13] = dVar20;
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (pi == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_00136a18:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_predictive_info(int const *series, size_t n, size_t m,
    int b, size_t kpast, size_t kfuture, double *pi, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NULL;

    size_t const N = n * (m - kpast - kfuture + 1);

    bool allocate_pi = (pi == NULL);
    if (allocate_pi)
    {
        pi = malloc(N * sizeof(double));
        if (pi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_pi) free(pi);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_pi) free(pi);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures, state, history, future);

    double s, h, f;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        f = futures.histogram[future[i]];
        pi[i] = log2((s * N) / (h * f));
    }

    free(state_data);
    free(histogram_data);

    return pi;
}